

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-shell.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
Shell::checkNaN(Result<wasm::Ok> *__return_storage_ptr__,Shell *this,Literal *val,NaNResult nan)

{
  Literal LVar1;
  Literal LVar2;
  bool bVar3;
  byte bVar4;
  ostream *poVar5;
  Type TVar6;
  undefined8 in_stack_fffffffffffffd48;
  undefined8 in_stack_fffffffffffffd50;
  Type in_stack_fffffffffffffd58;
  Ok local_251;
  Err local_250;
  Literal local_230;
  NaNResult local_218;
  Err local_208;
  Literal local_1e8;
  NaNResult local_1d0;
  stringstream local_1b8 [8];
  stringstream err;
  ostream local_1a8 [376];
  Literal *local_30;
  Literal *val_local;
  Shell *this_local;
  NaNResult nan_local;
  
  nan_local._0_8_ = nan.type.id;
  this_local._0_4_ = nan.kind;
  local_30 = val;
  val_local = (Literal *)this;
  nan_local.type.id = (uintptr_t)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  if ((NaNKind)this_local == Canonical) {
    bVar3 = ::wasm::Type::operator!=(&val->type,(Type *)&nan_local);
    if ((bVar3) || (bVar4 = ::wasm::Literal::isCanonicalNaN(), (bVar4 & 1) == 0)) {
      poVar5 = std::operator<<(local_1a8,"expected canonical ");
      local_1d0.kind = nan_local.kind;
      local_1d0._4_4_ = nan_local._4_4_;
      poVar5 = (ostream *)::wasm::operator<<(poVar5,(Type)nan_local._0_8_);
      poVar5 = std::operator<<(poVar5," NaN, got ");
      ::wasm::Literal::Literal(&local_1e8,val);
      LVar1.field_0.func.super_IString.str._M_str = (char *)in_stack_fffffffffffffd50;
      LVar1.field_0.i64 = in_stack_fffffffffffffd48;
      LVar1.type.id = in_stack_fffffffffffffd58.id;
      ::wasm::operator<<(poVar5,LVar1);
      ::wasm::Literal::~Literal(&local_1e8);
      std::__cxx11::stringstream::str();
      ::wasm::Result<wasm::Ok>::Result(__return_storage_ptr__,&local_208);
      ::wasm::Err::~Err(&local_208);
      goto LAB_001e56b9;
    }
  }
  else if (((NaNKind)this_local == Arithmetic) &&
          ((bVar3 = ::wasm::Type::operator!=(&val->type,(Type *)&nan_local), bVar3 ||
           (bVar4 = ::wasm::Literal::isArithmeticNaN(), (bVar4 & 1) == 0)))) {
    poVar5 = std::operator<<(local_1a8,"expected arithmetic ");
    local_218.kind = nan_local.kind;
    local_218._4_4_ = nan_local._4_4_;
    TVar6.id = ::wasm::operator<<(poVar5,(Type)nan_local._0_8_);
    poVar5 = std::operator<<((ostream *)TVar6.id," NaN, got ");
    ::wasm::Literal::Literal(&local_230,val);
    LVar2.field_0.func.super_IString.str._M_str = (char *)poVar5;
    LVar2.field_0.i64 = in_stack_fffffffffffffd48;
    LVar2.type.id = TVar6.id;
    ::wasm::operator<<(poVar5,LVar2);
    ::wasm::Literal::~Literal(&local_230);
    std::__cxx11::stringstream::str();
    ::wasm::Result<wasm::Ok>::Result(__return_storage_ptr__,&local_250);
    ::wasm::Err::~Err(&local_250);
    goto LAB_001e56b9;
  }
  ::wasm::Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_251);
LAB_001e56b9:
  local_218.type.id._4_4_ = 1;
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

Result<> checkNaN(Literal val, NaNResult nan) {
    std::stringstream err;
    switch (nan.kind) {
      case NaNKind::Canonical:
        if (val.type != nan.type || !val.isCanonicalNaN()) {
          err << "expected canonical " << nan.type << " NaN, got " << val;
          return Err{err.str()};
        }
        break;
      case NaNKind::Arithmetic:
        if (val.type != nan.type || !val.isArithmeticNaN()) {
          err << "expected arithmetic " << nan.type << " NaN, got " << val;
          return Err{err.str()};
        }
        break;
    }
    return Ok{};
  }